

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tap.c
# Opt level: O0

int cmp_ok_at_loc(char *file,int line,int a,char *op,int b,char *fmt,...)

{
  char in_AL;
  int iVar1;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  uint local_158;
  uint local_154;
  uint local_150;
  uint local_14c;
  uint local_148;
  uint local_144;
  uint local_140;
  uint local_13c;
  uint local_138;
  uint local_134;
  uint local_130;
  uint local_12c;
  uint local_128;
  uint local_124;
  uint local_120;
  uint local_11c;
  uint local_118;
  bool local_111;
  uint local_110;
  bool local_109;
  undefined1 local_108 [48];
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined1 local_58 [8];
  va_list args;
  int test;
  char *fmt_local;
  int b_local;
  char *op_local;
  int a_local;
  int line_local;
  char *file_local;
  
  if (in_AL != '\0') {
    local_d8 = in_XMM0_Qa;
    local_c8 = in_XMM1_Qa;
    local_b8 = in_XMM2_Qa;
    local_a8 = in_XMM3_Qa;
    local_98 = in_XMM4_Qa;
    local_88 = in_XMM5_Qa;
    local_78 = in_XMM6_Qa;
    local_68 = in_XMM7_Qa;
  }
  iVar1 = mystrcmp(op,"||");
  if (iVar1 == 0) {
    local_109 = a != 0 || b != 0;
    local_110 = (uint)local_109;
  }
  else {
    iVar1 = mystrcmp(op,"&&");
    if (iVar1 == 0) {
      local_111 = a != 0 && b != 0;
      local_118 = (uint)local_111;
    }
    else {
      iVar1 = mystrcmp(op,"|");
      if (iVar1 == 0) {
        local_11c = a | b;
      }
      else {
        iVar1 = mystrcmp(op,"^");
        if (iVar1 == 0) {
          local_120 = a ^ b;
        }
        else {
          iVar1 = mystrcmp(op,"&");
          if (iVar1 == 0) {
            local_124 = a & b;
          }
          else {
            iVar1 = mystrcmp(op,"==");
            if (iVar1 == 0) {
              local_128 = (uint)(a == b);
            }
            else {
              iVar1 = mystrcmp(op,"!=");
              if (iVar1 == 0) {
                local_12c = (uint)(a != b);
              }
              else {
                iVar1 = mystrcmp(op,"<");
                if (iVar1 == 0) {
                  local_130 = (uint)(a < b);
                }
                else {
                  iVar1 = mystrcmp(op,">");
                  if (iVar1 == 0) {
                    local_134 = (uint)(b < a);
                  }
                  else {
                    iVar1 = mystrcmp(op,"<=");
                    if (iVar1 == 0) {
                      local_138 = (uint)(a <= b);
                    }
                    else {
                      iVar1 = mystrcmp(op,">=");
                      if (iVar1 == 0) {
                        local_13c = (uint)(b <= a);
                      }
                      else {
                        iVar1 = mystrcmp(op,"<<");
                        if (iVar1 == 0) {
                          local_140 = a << ((byte)b & 0x1f);
                        }
                        else {
                          iVar1 = mystrcmp(op,">>");
                          if (iVar1 == 0) {
                            local_144 = a >> ((byte)b & 0x1f);
                          }
                          else {
                            iVar1 = mystrcmp(op,"+");
                            if (iVar1 == 0) {
                              local_148 = a + b;
                            }
                            else {
                              iVar1 = mystrcmp(op,"-");
                              if (iVar1 == 0) {
                                local_14c = a - b;
                              }
                              else {
                                iVar1 = mystrcmp(op,"*");
                                if (iVar1 == 0) {
                                  local_150 = a * b;
                                }
                                else {
                                  iVar1 = mystrcmp(op,"/");
                                  if (iVar1 == 0) {
                                    local_154 = a / b;
                                  }
                                  else {
                                    iVar1 = mystrcmp(op,"%");
                                    if (iVar1 == 0) {
                                      local_158 = a % b;
                                    }
                                    else {
                                      local_158 = diag("unrecognized operator \'%s\'",op);
                                    }
                                    local_154 = local_158;
                                  }
                                  local_150 = local_154;
                                }
                                local_14c = local_150;
                              }
                              local_148 = local_14c;
                            }
                            local_144 = local_148;
                          }
                          local_140 = local_144;
                        }
                        local_13c = local_140;
                      }
                      local_138 = local_13c;
                    }
                    local_134 = local_138;
                  }
                  local_130 = local_134;
                }
                local_12c = local_130;
              }
              local_128 = local_12c;
            }
            local_124 = local_128;
          }
          local_120 = local_124;
        }
        local_11c = local_120;
      }
      local_118 = local_11c;
    }
    local_110 = local_118;
  }
  args[0].overflow_arg_area = local_108;
  args[0]._0_8_ = &stack0x00000008;
  local_58._4_4_ = 0x30;
  local_58._0_4_ = 0x30;
  vok_at_loc(file,line,local_110,fmt,(__va_list_tag *)local_58);
  if (local_110 == 0) {
    diag("    %d",(ulong)(uint)a);
    diag("        %s",op);
    diag("    %d",(ulong)(uint)b);
  }
  return local_110;
}

Assistant:

int
cmp_ok_at_loc (const char *file, int line, int a, const char *op, int b,
               const char *fmt, ...)
{
    int test = eq(op, "||") ? a || b
             : eq(op, "&&") ? a && b
             : eq(op, "|")  ? a |  b
             : eq(op, "^")  ? a ^  b
             : eq(op, "&")  ? a &  b
             : eq(op, "==") ? a == b
             : eq(op, "!=") ? a != b
             : eq(op, "<")  ? a <  b
             : eq(op, ">")  ? a >  b
             : eq(op, "<=") ? a <= b
             : eq(op, ">=") ? a >= b
             : eq(op, "<<") ? a << b
             : eq(op, ">>") ? a >> b
             : eq(op, "+")  ? a +  b
             : eq(op, "-")  ? a -  b
             : eq(op, "*")  ? a *  b
             : eq(op, "/")  ? a /  b
             : eq(op, "%")  ? a %  b
             : diag("unrecognized operator '%s'", op);
    va_list args;
    va_start(args, fmt);
    vok_at_loc(file, line, test, fmt, args);
    va_end(args);
    if (!test) {
        diag("    %d", a);
        diag("        %s", op);
        diag("    %d", b);
    }
    return test;
}